

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O3

bool WTF::Symbolize(void *pc,char *out,int out_size)

{
  short *psVar1;
  short *psVar2;
  bool bVar3;
  Elf64_Word EVar4;
  int *piVar5;
  short *psVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t sVar9;
  char *pcVar10;
  short *psVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  FileDescriptor wrapped_maps_fd;
  char *eol;
  uint64_t start_address;
  char *cursor;
  uint64_t end_address;
  LineReader reader;
  char buf [1024];
  FileDescriptor local_4ec;
  FileDescriptor local_4e8;
  undefined4 uStack_4e4;
  ulong local_4e0;
  char *local_4d8;
  char *local_4d0;
  short *local_4c8 [8];
  uint64_t local_488;
  void *local_480;
  undefined1 local_478 [64];
  int local_438 [4];
  undefined2 local_428;
  long local_410;
  Elf64_Half local_3fc;
  
  if (out_size < 0) {
LAB_00106a5c:
    abort();
  }
  local_4d0 = (char *)0x0;
  if (out_size != 0) {
    *out = '\0';
    SafeAppendString("(",out,out_size);
    local_4d8 = out + 1;
    do {
      EVar4 = open("/proc/self/maps",0);
      local_4ec.fd_ = EVar4;
      if (-1 < (int)EVar4) {
        local_478._8_8_ = local_438;
        local_478._16_4_ = 0x400;
        iVar13 = 0;
        local_4e0 = (long)out_size - 1U;
        local_478._0_4_ = EVar4;
        local_478._24_8_ = local_478._8_8_;
        local_478._32_8_ = local_478._8_8_;
        local_478._40_8_ = local_478._8_8_;
        goto LAB_00106649;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    FileDescriptor::~FileDescriptor(&local_4ec);
    lVar15 = 0;
    uVar12 = (long)out_size - 1U;
    goto LAB_00106733;
  }
  goto LAB_001067a5;
LAB_00106649:
  bVar3 = LineReader::ReadLine((LineReader *)local_478,(char **)local_4c8,(char **)&local_4e8);
  if (!bVar3) goto LAB_00106721;
  local_4c8[0] = (short *)GetHex((char *)local_4c8[0],(char *)CONCAT44(uStack_4e4,local_4e8.fd_),
                                 (uint64_t *)&local_4d0);
  if ((local_4c8[0] == (short *)CONCAT44(uStack_4e4,local_4e8.fd_)) || ((char)*local_4c8[0] != '-'))
  goto LAB_00106721;
  local_4c8[0] = (short *)((long)local_4c8[0] + 1);
  psVar6 = (short *)GetHex((char *)local_4c8[0],(char *)CONCAT44(uStack_4e4,local_4e8.fd_),
                           (uint64_t *)&local_480);
  pcVar7 = local_4d0;
  psVar2 = (short *)CONCAT44(uStack_4e4,local_4e8.fd_);
  local_4c8[0] = psVar6;
  if ((psVar6 == psVar2) || ((char)*psVar6 != ' ')) goto LAB_00106721;
  psVar1 = (short *)((long)psVar6 + 1);
  local_4c8[0] = psVar1;
  if ((local_4d0 <= pc) && (pc < local_480)) {
    if (psVar2 <= psVar1) goto LAB_00106721;
    do {
      psVar11 = local_4c8[0];
      if ((char)*local_4c8[0] == ' ') break;
      local_4c8[0] = (short *)((long)local_4c8[0] + 1);
      psVar11 = psVar2;
    } while (local_4c8[0] != psVar2);
    if ((psVar11 == psVar2) || (psVar11 < (short *)((long)psVar6 + 5))) goto LAB_00106721;
    if (*(char *)((long)psVar6 + 3) == 'x' && *psVar1 == 0x2d72) {
      local_4c8[0] = (short *)((long)psVar11 + 1);
      local_4c8[0] = (short *)GetHex((char *)local_4c8[0],(char *)psVar2,&local_488);
      psVar2 = (short *)CONCAT44(uStack_4e4,local_4e8.fd_);
      uVar12 = local_4e0;
      if (local_4c8[0] == psVar2) {
        lVar15 = 0;
        goto LAB_0010687f;
      }
      if ((char)*local_4c8[0] != ' ') {
        lVar15 = 0;
        goto LAB_0010687f;
      }
      local_4c8[0] = (short *)((long)local_4c8[0] + 1);
      pcVar10 = (char *)0x0;
      pcVar14 = pcVar7;
      if (iVar13 == 0) {
        pcVar14 = pcVar10;
      }
      psVar6 = local_4c8[0];
      if (local_4c8[0] < psVar2) goto LAB_00106809;
      goto LAB_00106827;
    }
  }
  iVar13 = iVar13 + 1;
  goto LAB_00106649;
LAB_00106721:
  FileDescriptor::~FileDescriptor(&local_4ec);
  lVar15 = 0;
  uVar12 = local_4e0;
  goto LAB_00106733;
LAB_00106809:
  do {
    if ((char)*local_4c8[0] == ' ') {
      pcVar10 = (char *)(ulong)((int)pcVar10 + 1);
    }
    else {
      psVar6 = local_4c8[0];
      if (1 < (int)pcVar10) break;
    }
    local_4c8[0] = (short *)((long)local_4c8[0] + 1);
    psVar6 = psVar2;
  } while (local_4c8[0] != psVar2);
LAB_00106827:
  lVar15 = (long)pcVar14 - local_488;
  if (psVar6 != psVar2) {
    do {
      iVar13 = open((char *)local_4c8[0],0);
      if (-1 < iVar13) {
        FileDescriptor::~FileDescriptor(&local_4ec);
        local_4e8.fd_ = iVar13;
        sVar8 = ReadFromOffset(iVar13,local_438,0x40,0);
        bVar3 = false;
        if ((sVar8 != 0x40) || (bVar3 = false, local_438[0] != 0x464c457f)) goto LAB_00106a4d;
        sVar8 = ReadFromOffset(iVar13,local_438,0x40,0);
        if (sVar8 == 0x40) {
          local_4d8 = (char *)0x0;
          if (local_428 == 3) {
            local_4d8 = pcVar7;
          }
          bVar3 = GetSectionHeaderByType(iVar13,local_3fc,local_410,2,(Elf64_Shdr *)local_478);
          if (bVar3) {
            sVar8 = ReadFromOffset(iVar13,local_4c8,0x40,
                                   (local_478._40_8_ & 0xffffffff) * 0x40 + local_410);
            if (sVar8 == 0x40) {
              bVar3 = FindSymbol((uint64_t)pc,iVar13,out,out_size,(uint64_t)local_4d8,
                                 (Elf64_Shdr *)local_4c8,(Elf64_Shdr *)local_478);
              if (!bVar3) goto LAB_0010698b;
              goto LAB_001069fc;
            }
          }
          else {
LAB_0010698b:
            bVar3 = GetSectionHeaderByType(iVar13,local_3fc,local_410,0xb,(Elf64_Shdr *)local_478);
            if (((bVar3) &&
                (sVar8 = ReadFromOffset(iVar13,local_4c8,0x40,
                                        (local_478._40_8_ & 0xffffffff) * 0x40 + local_410),
                sVar8 == 0x40)) &&
               (bVar3 = FindSymbol((uint64_t)pc,iVar13,out,out_size,(uint64_t)local_4d8,
                                   (Elf64_Shdr *)local_4c8,(Elf64_Shdr *)local_478), bVar3)) {
LAB_001069fc:
              bVar3 = Demangle(out,(char *)local_438,0x100);
              if (bVar3) {
                sVar9 = strlen((char *)local_438);
                if (sVar9 + 1 <= (ulong)(uint)out_size) {
                  if (0xff < sVar9) goto LAB_00106a5c;
                  memcpy(out,local_438,sVar9 + 1);
                }
              }
              bVar3 = true;
              goto LAB_00106a4d;
            }
          }
        }
        bVar3 = false;
LAB_00106a4d:
        FileDescriptor::~FileDescriptor(&local_4e8);
        return bVar3;
      }
      piVar5 = __errno_location();
      pcVar14 = local_4d8;
      uVar12 = local_4e0;
    } while (*piVar5 == 4);
    strncpy(local_4d8,(char *)local_4c8[0],local_4e0 & 0xffffffff);
    pcVar14[uVar12 - 1] = '\0';
  }
LAB_0010687f:
  FileDescriptor::~FileDescriptor(&local_4ec);
LAB_00106733:
  if (*local_4d8 == '\0') {
LAB_001067a5:
    bVar3 = false;
  }
  else {
    out[uVar12 & 0xffffffff] = '\0';
    SafeAppendString("+0x",out,out_size);
    local_428 = (ushort)local_428._1_1_ << 8;
    local_438[0] = 0;
    local_438[1] = 0;
    local_438[2] = 0;
    local_438[3] = 0;
    pcVar7 = itoa_r((long)pc - lVar15,(char *)local_438,0x11,0x10,0);
    SafeAppendString(pcVar7,out,out_size);
    SafeAppendString(")",out,out_size);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Symbolize(void *pc, char *out, int out_size) {
    SAFE_ASSERT(out_size >= 0);
    return SymbolizeAndDemangle(pc, out, out_size);
}